

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3WindowRewrite(Parse *pParse,Select *p)

{
  SrcList **ppSVar1;
  sqlite3 *db;
  Expr *pWhere;
  ExprList *pGroupBy;
  Expr *pHaving;
  Window *pWVar2;
  int iVar3;
  int iVar4;
  Vdbe *p_00;
  Table *p_01;
  ExprList *pEVar5;
  ExprList *pEVar6;
  Expr *pEVar7;
  Select *p_02;
  SrcList *pSVar8;
  Table *pTVar9;
  long lVar10;
  Table *pTVar11;
  Table *pTVar12;
  Window *pWVar13;
  byte bVar14;
  Walker local_88;
  Window *local_58;
  SrcList *local_50;
  ExprList *local_48;
  Table *local_40;
  undefined8 local_38;
  
  bVar14 = 0;
  iVar3 = 0;
  if ((p->pWin != (Window *)0x0) && (p->pPrior == (Select *)0x0)) {
    p_00 = sqlite3GetVdbe(pParse);
    db = pParse->db;
    pSVar8 = p->pSrc;
    pWhere = p->pWhere;
    pGroupBy = p->pGroupBy;
    pHaving = p->pHaving;
    pWVar2 = p->pWin;
    p_01 = (Table *)sqlite3DbMallocZero(db,0x80);
    if (p_01 == (Table *)0x0) {
      iVar3 = 7;
    }
    else {
      ppSVar1 = &p->pSrc;
      p->pGroupBy = (ExprList *)0x0;
      p->pHaving = (Expr *)0x0;
      *ppSVar1 = (SrcList *)0x0;
      p->pWhere = (Expr *)0x0;
      *(byte *)&p->selFlags = (byte)p->selFlags & 0xf7;
      pEVar5 = sqlite3ExprListDup(db,pWVar2->pPartition,0);
      pEVar5 = exprListAppendList(pParse,pEVar5,pWVar2->pOrderBy,1);
      if (((pEVar5 != (ExprList *)0x0) && (p->pOrderBy != (ExprList *)0x0)) &&
         (iVar3 = sqlite3ExprListCompare(pEVar5,p->pOrderBy,-1), iVar3 == 0)) {
        if (p->pOrderBy != (ExprList *)0x0) {
          exprListDeleteNN(db,p->pOrderBy);
        }
        p->pOrderBy = (ExprList *)0x0;
      }
      iVar3 = pParse->nTab;
      pWVar2->iEphCsr = iVar3;
      pParse->nTab = iVar3 + 4;
      local_88.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
      local_88.walkerDepth = 0;
      local_88.eCode = '\0';
      local_88._37_3_ = 0;
      local_38 = 0;
      local_48 = (ExprList *)0x0;
      local_88.xExprCallback = selectWindowRewriteExprCb;
      local_88.xSelectCallback = selectWindowRewriteSelectCb;
      local_88.pParse = pParse;
      local_88.u.pNC = (NameContext *)&local_58;
      local_58 = pWVar2;
      local_50 = pSVar8;
      local_40 = p_01;
      sqlite3WalkExprList(&local_88,p->pEList);
      iVar3 = 0;
      local_88.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
      local_88.walkerDepth = 0;
      local_88.eCode = '\0';
      local_88._37_3_ = 0;
      local_38 = 0;
      local_88.xExprCallback = selectWindowRewriteExprCb;
      local_88.xSelectCallback = selectWindowRewriteSelectCb;
      local_88.pParse = pParse;
      local_88.u.pNC = (NameContext *)&local_58;
      local_58 = pWVar2;
      local_50 = pSVar8;
      local_40 = p_01;
      sqlite3WalkExprList(&local_88,p->pOrderBy);
      if (local_48 != (ExprList *)0x0) {
        iVar3 = local_48->nExpr;
      }
      pWVar2->nBufferCol = iVar3;
      pEVar6 = exprListAppendList(pParse,local_48,pWVar2->pPartition,0);
      pEVar6 = exprListAppendList(pParse,pEVar6,pWVar2->pOrderBy,0);
      pWVar13 = pWVar2;
      do {
        iVar3 = 0;
        if (pEVar6 != (ExprList *)0x0) {
          iVar3 = pEVar6->nExpr;
        }
        pWVar13->iArgCol = iVar3;
        pEVar6 = exprListAppendList(pParse,pEVar6,(pWVar13->pOwner->x).pList,0);
        if (pWVar13->pFilter != (Expr *)0x0) {
          pEVar7 = exprDup(db,pWVar13->pFilter,0,(u8 **)0x0);
          pEVar6 = sqlite3ExprListAppend((Parse *)pParse->db,pEVar6,pEVar7);
        }
        iVar4 = pParse->nMem;
        iVar3 = iVar4 + 1;
        pWVar13->regAccum = iVar3;
        iVar4 = iVar4 + 2;
        pParse->nMem = iVar4;
        pWVar13->regResult = iVar4;
        sqlite3VdbeAddOp3(p_00,0x49,0,iVar3,0);
        pWVar13 = pWVar13->pNextWin;
      } while (pWVar13 != (Window *)0x0);
      if (pEVar6 == (ExprList *)0x0) {
        pEVar7 = sqlite3ExprAlloc(db,0x93,sqlite3IntTokens,0);
        pEVar6 = sqlite3ExprListAppend((Parse *)pParse->db,(ExprList *)0x0,pEVar7);
      }
      p_02 = sqlite3SelectNew(pParse,pEVar6,pSVar8,pWhere,pGroupBy,pHaving,pEVar5,0,(Expr *)0x0);
      iVar4 = 0;
      pSVar8 = sqlite3SrcListAppend(pParse,(SrcList *)0x0,(Token *)0x0,(Token *)0x0);
      *ppSVar1 = pSVar8;
      if (pSVar8 == (SrcList *)0x0) {
        if (p_02 != (Select *)0x0) {
          clearSelect(db,p_02,1);
        }
      }
      else {
        pSVar8->a[0].pSelect = p_02;
        sqlite3SrcListAssignCursors(pParse,pSVar8);
        *(byte *)&p_02->selFlags = (byte)p_02->selFlags | 0x40;
        pTVar9 = sqlite3ResultSetOfSelect(pParse,p_02);
        if (pTVar9 == (Table *)0x0) {
          iVar4 = 7;
        }
        else {
          pTVar11 = pTVar9;
          pTVar12 = p_01;
          for (lVar10 = 0x10; lVar10 != 0; lVar10 = lVar10 + -1) {
            pTVar12->zName = pTVar11->zName;
            pTVar11 = (Table *)((long)pTVar11 + (ulong)bVar14 * -0x10 + 8);
            pTVar12 = (Table *)((long)pTVar12 + (ulong)bVar14 * -0x10 + 8);
          }
          *(byte *)&p_01->tabFlags = (byte)p_01->tabFlags | 2;
          (*ppSVar1)->a[0].pTab = p_01;
          iVar4 = 0;
          p_01 = pTVar9;
        }
        sqlite3VdbeAddOp3(p_00,0x71,pWVar2->iEphCsr,pEVar6->nExpr,0);
        sqlite3VdbeAddOp3(p_00,0x6f,pWVar2->iEphCsr + 1,pWVar2->iEphCsr,0);
        sqlite3VdbeAddOp3(p_00,0x6f,pWVar2->iEphCsr + 2,pWVar2->iEphCsr,0);
        sqlite3VdbeAddOp3(p_00,0x6f,pWVar2->iEphCsr + 3,pWVar2->iEphCsr,0);
      }
      iVar3 = 7;
      if (db->mallocFailed == '\0') {
        iVar3 = iVar4;
      }
      sqlite3DbFreeNN(db,p_01);
    }
  }
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3WindowRewrite(Parse *pParse, Select *p){
  int rc = SQLITE_OK;
  if( p->pWin && p->pPrior==0 ){
    Vdbe *v = sqlite3GetVdbe(pParse);
    sqlite3 *db = pParse->db;
    Select *pSub = 0;             /* The subquery */
    SrcList *pSrc = p->pSrc;
    Expr *pWhere = p->pWhere;
    ExprList *pGroupBy = p->pGroupBy;
    Expr *pHaving = p->pHaving;
    ExprList *pSort = 0;

    ExprList *pSublist = 0;       /* Expression list for sub-query */
    Window *pMWin = p->pWin;      /* Master window object */
    Window *pWin;                 /* Window object iterator */
    Table *pTab;

    pTab = sqlite3DbMallocZero(db, sizeof(Table));
    if( pTab==0 ){
      return SQLITE_NOMEM;
    }

    p->pSrc = 0;
    p->pWhere = 0;
    p->pGroupBy = 0;
    p->pHaving = 0;
    p->selFlags &= ~SF_Aggregate;

    /* Create the ORDER BY clause for the sub-select. This is the concatenation
    ** of the window PARTITION and ORDER BY clauses. Then, if this makes it
    ** redundant, remove the ORDER BY from the parent SELECT.  */
    pSort = sqlite3ExprListDup(db, pMWin->pPartition, 0);
    pSort = exprListAppendList(pParse, pSort, pMWin->pOrderBy, 1);
    if( pSort && p->pOrderBy ){
      if( sqlite3ExprListCompare(pSort, p->pOrderBy, -1)==0 ){
        sqlite3ExprListDelete(db, p->pOrderBy);
        p->pOrderBy = 0;
      }
    }

    /* Assign a cursor number for the ephemeral table used to buffer rows.
    ** The OpenEphemeral instruction is coded later, after it is known how
    ** many columns the table will have.  */
    pMWin->iEphCsr = pParse->nTab++;
    pParse->nTab += 3;

    selectWindowRewriteEList(pParse, pMWin, pSrc, p->pEList, pTab, &pSublist);
    selectWindowRewriteEList(pParse, pMWin, pSrc, p->pOrderBy, pTab, &pSublist);
    pMWin->nBufferCol = (pSublist ? pSublist->nExpr : 0);

    /* Append the PARTITION BY and ORDER BY expressions to the to the 
    ** sub-select expression list. They are required to figure out where 
    ** boundaries for partitions and sets of peer rows lie.  */
    pSublist = exprListAppendList(pParse, pSublist, pMWin->pPartition, 0);
    pSublist = exprListAppendList(pParse, pSublist, pMWin->pOrderBy, 0);

    /* Append the arguments passed to each window function to the
    ** sub-select expression list. Also allocate two registers for each
    ** window function - one for the accumulator, another for interim
    ** results.  */
    for(pWin=pMWin; pWin; pWin=pWin->pNextWin){
      pWin->iArgCol = (pSublist ? pSublist->nExpr : 0);
      pSublist = exprListAppendList(pParse, pSublist, pWin->pOwner->x.pList, 0);
      if( pWin->pFilter ){
        Expr *pFilter = sqlite3ExprDup(db, pWin->pFilter, 0);
        pSublist = sqlite3ExprListAppend(pParse, pSublist, pFilter);
      }
      pWin->regAccum = ++pParse->nMem;
      pWin->regResult = ++pParse->nMem;
      sqlite3VdbeAddOp2(v, OP_Null, 0, pWin->regAccum);
    }

    /* If there is no ORDER BY or PARTITION BY clause, and the window
    ** function accepts zero arguments, and there are no other columns
    ** selected (e.g. "SELECT row_number() OVER () FROM t1"), it is possible
    ** that pSublist is still NULL here. Add a constant expression here to 
    ** keep everything legal in this case. 
    */
    if( pSublist==0 ){
      pSublist = sqlite3ExprListAppend(pParse, 0, 
          sqlite3ExprAlloc(db, TK_INTEGER, &sqlite3IntTokens[0], 0)
      );
    }

    pSub = sqlite3SelectNew(
        pParse, pSublist, pSrc, pWhere, pGroupBy, pHaving, pSort, 0, 0
    );
    p->pSrc = sqlite3SrcListAppend(pParse, 0, 0, 0);
    if( p->pSrc ){
      Table *pTab2;
      p->pSrc->a[0].pSelect = pSub;
      sqlite3SrcListAssignCursors(pParse, p->pSrc);
      pSub->selFlags |= SF_Expanded;
      pTab2 = sqlite3ResultSetOfSelect(pParse, pSub);
      if( pTab2==0 ){
        rc = SQLITE_NOMEM;
      }else{
        memcpy(pTab, pTab2, sizeof(Table));
        pTab->tabFlags |= TF_Ephemeral;
        p->pSrc->a[0].pTab = pTab;
        pTab = pTab2;
      }
      sqlite3VdbeAddOp2(v, OP_OpenEphemeral, pMWin->iEphCsr, pSublist->nExpr);
      sqlite3VdbeAddOp2(v, OP_OpenDup, pMWin->iEphCsr+1, pMWin->iEphCsr);
      sqlite3VdbeAddOp2(v, OP_OpenDup, pMWin->iEphCsr+2, pMWin->iEphCsr);
      sqlite3VdbeAddOp2(v, OP_OpenDup, pMWin->iEphCsr+3, pMWin->iEphCsr);
    }else{
      sqlite3SelectDelete(db, pSub);
    }
    if( db->mallocFailed ) rc = SQLITE_NOMEM;
    sqlite3DbFree(db, pTab);
  }

  return rc;
}